

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void EvaluatePolicy(CMDP *PolicyMDP,int StartStateID,int GoalStateID,double *PolValue,
                   bool *bFullPolicy,double *Pcgoal,int *nMerges,bool *bCycles)

{
  float fVar1;
  double dVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  _Ios_Openmode _Var7;
  size_type sVar8;
  ulong uVar9;
  reference ppCVar10;
  undefined8 uVar11;
  reference ppCVar12;
  reference pvVar13;
  reference pvVar14;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  string *in_RDI;
  undefined1 *in_R8;
  undefined8 *in_R9;
  int *in_stack_00000008;
  byte *in_stack_00000010;
  double OutProb;
  double PredPc;
  int oind_1;
  int nMerge;
  double Pc;
  stringstream ss;
  int oind;
  double Q;
  CMDPACTION *action;
  CMDPSTATE *state;
  bool bFirstIter;
  double *Pcvals;
  double *vals;
  double mindelta;
  double delta;
  int startind;
  int j;
  int i;
  string *in_stack_fffffffffffffd08;
  value_type in_stack_fffffffffffffd10;
  allocator<char> *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  ostream *this;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  int local_278;
  int local_274;
  double local_270;
  CMDPSTATE *in_stack_fffffffffffffda0;
  CMDPSTATE *in_stack_fffffffffffffda8;
  CMDP *in_stack_fffffffffffffdb0;
  allocator<char> local_229;
  string local_228 [32];
  stringstream local_208 [16];
  ostream local_1f8 [380];
  int local_7c;
  double local_78;
  value_type local_70;
  value_type local_68;
  byte local_59;
  void *local_58;
  void *local_50;
  double local_48;
  double local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  int local_10;
  int local_c;
  string *local_8;
  
  local_34 = -1;
  local_40 = 1000000000.0;
  local_48 = 0.1;
  *in_R9 = 0;
  *in_stack_00000008 = 0;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  sVar8 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                    ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)in_RDI);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar8;
  uVar9 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_50 = operator_new__(uVar9);
  sVar8 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                    ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar8;
  uVar9 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_58 = operator_new__(uVar9);
  for (local_2c = 0; iVar3 = local_2c,
      sVar8 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                        ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8),
      iVar3 < (int)sVar8; local_2c = local_2c + 1) {
    *(undefined8 *)((long)local_50 + (long)local_2c * 8) = 0;
    *(undefined8 *)((long)local_58 + (long)local_2c * 8) = 0;
    ppCVar10 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                         ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,
                          (long)local_2c);
    if ((*ppCVar10)->StateID == local_c) {
      local_34 = local_2c;
      *(undefined8 *)((long)local_58 + (long)local_2c * 8) = 0x3ff0000000000000;
    }
  }
  *local_20 = 1;
  local_59 = 1;
  do {
    if (local_40 <= local_48) {
      *local_18 = *(undefined8 *)((long)local_50 + (long)local_34 * 8);
      return;
    }
    local_40 = 0.0;
    for (local_2c = 0; iVar3 = local_2c,
        sVar8 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                          ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8),
        iVar3 < (int)sVar8; local_2c = local_2c + 1) {
      ppCVar10 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                           ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,
                            (long)local_2c);
      local_68 = *ppCVar10;
      if (local_68->StateID == local_10) {
        *(undefined8 *)((long)local_50 + (long)local_2c * 8) = 0;
      }
      else {
        sVar8 = std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::size(&local_68->Actions);
        if ((int)sVar8 == 0) {
          *local_20 = 0;
          *(undefined8 *)((long)local_50 + (long)local_2c * 8) = 0x412e848000000000;
          *local_18 = *(undefined8 *)((long)local_50 + (long)local_34 * 8);
          return;
        }
        ppCVar12 = std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::operator[]
                             (&local_68->Actions,0);
        local_70 = *ppCVar12;
        local_78 = 0.0;
        for (local_7c = 0; iVar3 = local_7c,
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_70->SuccsID),
            iVar3 < (int)sVar8; local_7c = local_7c + 1) {
          for (local_30 = 0; iVar3 = local_30,
              sVar8 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                                ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8),
              iVar3 < (int)sVar8; local_30 = local_30 + 1) {
            ppCVar10 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                                 ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,
                                  (long)local_30);
            iVar3 = (*ppCVar10)->StateID;
            pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_70->SuccsID,(long)local_7c);
            if (iVar3 == *pvVar13) break;
          }
          iVar3 = local_30;
          sVar8 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                            ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8);
          if (iVar3 == (int)sVar8) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                       in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
            _Var7 = std::operator|(_S_out,_S_in);
            std::__cxx11::stringstream::stringstream(local_208,local_228,_Var7);
            std::__cxx11::string::~string(local_228);
            std::allocator<char>::~allocator(&local_229);
            this = local_1f8;
            pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_70->SuccsID,(long)local_7c);
            std::ostream::operator<<(this,*pvVar13);
            uVar11 = __cxa_allocate_exception(0x10);
            std::__cxx11::stringstream::str();
            SBPL_Exception::SBPL_Exception
                      ((SBPL_Exception *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
            __cxa_throw(uVar11,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
          }
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&local_70->SuccsProb,(long)local_7c);
          fVar1 = *pvVar14;
          dVar2 = *(double *)((long)local_50 + (long)local_30 * 8);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&local_70->Costs,(long)local_7c);
          local_78 = (double)fVar1 * (dVar2 + (double)*pvVar13) + local_78;
        }
        if (local_78 < *(double *)((long)local_50 + (long)local_2c * 8)) {
          uVar11 = __cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception
                    ((SBPL_Exception *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
          __cxa_throw(uVar11,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
        }
        if (local_40 < local_78 - *(double *)((long)local_50 + (long)local_2c * 8)) {
          local_40 = local_78 - *(double *)((long)local_50 + (long)local_2c * 8);
        }
        *(double *)((long)local_50 + (long)local_2c * 8) = local_78;
      }
      local_270 = 0.0;
      local_274 = 0;
      for (local_30 = 0; iVar3 = local_30,
          sVar8 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                            ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8),
          iVar3 < (int)sVar8; local_30 = local_30 + 1) {
        local_278 = 0;
        while( true ) {
          ppCVar10 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                               ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,
                                (long)local_30);
          sVar8 = std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::size
                            (&(*ppCVar10)->Actions);
          bVar6 = false;
          if (0 < (int)sVar8) {
            ppCVar10 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                                 ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,
                                  (long)local_30);
            ppCVar12 = std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::operator[]
                                 (&(*ppCVar10)->Actions,0);
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppCVar12)->SuccsID);
            bVar6 = local_278 < (int)sVar8;
          }
          if (!bVar6) break;
          ppCVar10 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                               ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,
                                (long)local_30);
          ppCVar12 = std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::operator[]
                               (&(*ppCVar10)->Actions,0);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&(*ppCVar12)->SuccsID,(long)local_278);
          if (*pvVar13 == local_68->StateID) {
            dVar2 = *(double *)((long)local_58 + (long)local_30 * 8);
            ppCVar10 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                                 ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,
                                  (long)local_30);
            ppCVar12 = std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::operator[]
                                 (&(*ppCVar10)->Actions,0);
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&(*ppCVar12)->SuccsProb,(long)local_278);
            local_270 = (double)*pvVar14 * dVar2 + local_270;
            local_274 = local_274 + 1;
            if (((local_59 & 1) != 0) && ((*in_stack_00000010 & 1) == 0)) {
              in_stack_fffffffffffffd08 = local_8;
              in_stack_fffffffffffffd10 = local_68;
              std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                        ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)local_8,(long)local_30
                        );
              bVar6 = PathExists(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                                 in_stack_fffffffffffffda0);
              if (bVar6) {
                *in_stack_00000010 = 1;
              }
            }
          }
          local_278 = local_278 + 1;
        }
      }
      if ((((local_59 & 1) != 0) && (local_68->StateID != local_10)) && (0 < local_274)) {
        *in_stack_00000008 = local_274 + -1 + *in_stack_00000008;
      }
      if (local_68->StateID != local_c) {
        *(double *)((long)local_58 + (long)local_2c * 8) = local_270;
      }
      if (local_68->StateID == local_10) {
        *local_28 = *(undefined8 *)((long)local_58 + (long)local_2c * 8);
      }
    }
    local_59 = 0;
  } while( true );
}

Assistant:

void EvaluatePolicy(CMDP* PolicyMDP, int StartStateID, int GoalStateID, double* PolValue, bool *bFullPolicy,
                    double* Pcgoal, int *nMerges, bool* bCycles)
{
    int i, j, startind = -1;
    double delta = INFINITECOST;
    double mindelta = 0.1;

    *Pcgoal = 0;
    *nMerges = 0;

    SBPL_PRINTF("Evaluating policy...\n");

    //create and initialize values
    double* vals = new double[PolicyMDP->StateArray.size()];
    double* Pcvals = new double[PolicyMDP->StateArray.size()];
    for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
        vals[i] = 0;
        Pcvals[i] = 0;

        //remember the start index
        if (PolicyMDP->StateArray[i]->StateID == StartStateID) {
            startind = i;
            Pcvals[i] = 1;
        }
    }

    //initially assume full policy
    *bFullPolicy = true;
    bool bFirstIter = true;
    while (delta > mindelta) {
        delta = 0;
        for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
            //get the state
            CMDPSTATE* state = PolicyMDP->StateArray[i];

            //do the backup for values
            if (state->StateID == GoalStateID) {
                vals[i] = 0;
            }
            else if ((int)state->Actions.size() == 0) {
                *bFullPolicy = false;
                vals[i] = UNKNOWN_COST;
                *PolValue = vals[startind];
                return;
            }
            else {
                //normal backup
                CMDPACTION* action = state->Actions[0];

                //do backup
                double Q = 0;
                for (int oind = 0; oind < (int)action->SuccsID.size(); oind++) {
                    //get the state
                    for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                        if (PolicyMDP->StateArray[j]->StateID == action->SuccsID[oind]) break;
                    }
                    if (j == (int)PolicyMDP->StateArray.size()) {
                        std::stringstream ss("ERROR in EvaluatePolicy: incorrect successor ");
                        ss << action->SuccsID[oind];
                        throw SBPL_Exception(ss.str());
                    }
                    Q += action->SuccsProb[oind] * (vals[j] + action->Costs[oind]);
                }

                if (vals[i] > Q) {
                    throw SBPL_Exception("ERROR in EvaluatePolicy: val is decreasing");
                }

                //update delta
                if (delta < Q - vals[i]) delta = Q - vals[i];

                //set the value
                vals[i] = Q;
            }

            //iterate through all the predecessors and compute Pc
            double Pc = 0;
            //go over all predecessor states
            int nMerge = 0;
            for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                for (int oind = 0; (int)PolicyMDP->StateArray[j]->Actions.size() > 0 &&
                                   oind < (int)PolicyMDP->StateArray[j]->Actions[0]->SuccsID.size(); oind++)
                {
                    if (PolicyMDP->StateArray[j]->Actions[0]->SuccsID[oind] == state->StateID) {
                        //process the predecessor
                        double PredPc = Pcvals[j];
                        double OutProb = PolicyMDP->StateArray[j]->Actions[0]->SuccsProb[oind];

                        //accumulate into Pc
                        Pc = Pc + OutProb * PredPc;
                        nMerge++;

                        //check for cycles
                        if (bFirstIter && !(*bCycles)) {
                            if (PathExists(PolicyMDP, state, PolicyMDP->StateArray[j])) *bCycles = true;
                        }
                    }
                }
            }
            if (bFirstIter && state->StateID != GoalStateID && nMerge > 0) *nMerges += (nMerge - 1);

            //assign Pc
            if (state->StateID != StartStateID) Pcvals[i] = Pc;

            if (state->StateID == GoalStateID) *Pcgoal = Pcvals[i];
        } //over  states
        bFirstIter = false;
    } //until delta small

    *PolValue = vals[startind];

    SBPL_PRINTF("done\n");
}